

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestFactoryBase *factory)

{
  char *pcVar1;
  TestInfo *this;
  UnitTestImpl *this_00;
  allocator local_99;
  string local_98;
  allocator local_61;
  string local_60;
  TestInfo *local_40;
  TestInfo *test_info;
  SetUpTestCaseFunc set_up_tc_local;
  TypeId fixture_class_id_local;
  char *value_param_local;
  char *type_param_local;
  char *name_local;
  char *test_case_name_local;
  
  test_info = (TestInfo *)set_up_tc;
  set_up_tc_local = (SetUpTestCaseFunc)fixture_class_id;
  fixture_class_id_local = value_param;
  value_param_local = type_param;
  type_param_local = name;
  name_local = test_case_name;
  this = (TestInfo *)operator_new(0xb0);
  pcVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
  pcVar1 = type_param_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
  TestInfo::TestInfo(this,&local_60,&local_98,value_param_local,(char *)fixture_class_id_local,
                     set_up_tc_local,factory);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = this;
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,(SetUpTestCaseFunc)test_info,tear_down_tc,local_40);
  return local_40;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}